

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_csp.c
# Opt level: O0

void SharpYuvComputeConversionMatrix
               (SharpYuvColorSpace *yuv_color_space,SharpYuvConversionMatrix *matrix)

{
  int iVar1;
  int *in_RSI;
  float add_uv;
  float scale_v;
  float scale_u;
  float add_y;
  float scale_y;
  float denom;
  int shift;
  float cr;
  float cb;
  float kg;
  float kb;
  float kr;
  
  iVar1 = ToFixed16(0.0);
  *in_RSI = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[1] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[2] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[3] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[4] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[5] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[6] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[7] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[8] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[9] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[10] = iVar1;
  iVar1 = ToFixed16(0.0);
  in_RSI[0xb] = iVar1;
  return;
}

Assistant:

void SharpYuvComputeConversionMatrix(const SharpYuvColorSpace* yuv_color_space,
                                     SharpYuvConversionMatrix* matrix) {
  const float kr = yuv_color_space->kr;
  const float kb = yuv_color_space->kb;
  const float kg = 1.0f - kr - kb;
  const float cb = 0.5f / (1.0f - kb);
  const float cr = 0.5f / (1.0f - kr);

  const int shift = yuv_color_space->bit_depth - 8;

  const float denom = (float)((1 << yuv_color_space->bit_depth) - 1);
  float scale_y = 1.0f;
  float add_y = 0.0f;
  float scale_u = cb;
  float scale_v = cr;
  float add_uv = (float)(128 << shift);
  assert(yuv_color_space->bit_depth >= 8);

  if (yuv_color_space->range == kSharpYuvRangeLimited) {
    scale_y *= (219 << shift) / denom;
    scale_u *= (224 << shift) / denom;
    scale_v *= (224 << shift) / denom;
    add_y = (float)(16 << shift);
  }

  matrix->rgb_to_y[0] = ToFixed16(kr * scale_y);
  matrix->rgb_to_y[1] = ToFixed16(kg * scale_y);
  matrix->rgb_to_y[2] = ToFixed16(kb * scale_y);
  matrix->rgb_to_y[3] = ToFixed16(add_y);

  matrix->rgb_to_u[0] = ToFixed16(-kr * scale_u);
  matrix->rgb_to_u[1] = ToFixed16(-kg * scale_u);
  matrix->rgb_to_u[2] = ToFixed16((1 - kb) * scale_u);
  matrix->rgb_to_u[3] = ToFixed16(add_uv);

  matrix->rgb_to_v[0] = ToFixed16((1 - kr) * scale_v);
  matrix->rgb_to_v[1] = ToFixed16(-kg * scale_v);
  matrix->rgb_to_v[2] = ToFixed16(-kb * scale_v);
  matrix->rgb_to_v[3] = ToFixed16(add_uv);
}